

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint zlib_compress(uchar **out,size_t *outsize,uchar *in,size_t insize,
                  LodePNGCompressSettings *settings)

{
  uint uVar1;
  uchar *puVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sStack_40;
  uchar *puStack_38;
  
  if (settings->custom_zlib !=
      (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0) {
    uVar1 = (*settings->custom_zlib)(out,outsize,in,insize,settings);
    if (uVar1 != 0) {
      uVar1 = 0x6f;
    }
    return uVar1;
  }
  puStack_38 = (uchar *)0x0;
  sStack_40 = 0;
  if (settings->custom_deflate ==
      (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0) {
    uVar1 = lodepng_deflate(&puStack_38,&sStack_40,in,insize,settings);
    *out = (uchar *)0x0;
    *outsize = 0;
    if (uVar1 != 0) goto LAB_001b5300;
  }
  else {
    uVar1 = (*settings->custom_deflate)(&puStack_38,&sStack_40,in,insize,settings);
    if (uVar1 != 0) {
      *out = (uchar *)0x0;
      *outsize = 0;
      uVar1 = 0x6f;
      goto LAB_001b5300;
    }
  }
  sVar4 = sStack_40;
  *outsize = sStack_40 + 6;
  puVar2 = (uchar *)malloc(sStack_40 + 6);
  *out = puVar2;
  if (puVar2 == (uchar *)0x0) {
    uVar1 = 0x53;
  }
  else {
    uVar1 = adler32(in,(uint)insize);
    puVar2[0] = 'x';
    puVar2[1] = '\x01';
    for (sVar3 = 0; sVar3 != sVar4; sVar3 = sVar3 + 1) {
      (*out)[sVar3 + 2] = puStack_38[sVar3];
      sVar4 = sStack_40;
    }
    *(uint *)(*out + (*outsize - 4)) =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = 0;
  }
LAB_001b5300:
  free(puStack_38);
  return uVar1;
}

Assistant:

static unsigned zlib_compress(unsigned char** out, size_t* outsize, const unsigned char* in,
                              size_t insize, const LodePNGCompressSettings* settings) {
  if(settings->custom_zlib) {
    unsigned error = settings->custom_zlib(out, outsize, in, insize, settings);
    /*the custom zlib is allowed to have its own error codes, however, we translate it to code 111*/
    return error ? 111 : 0;
  } else {
    return lodepng_zlib_compress(out, outsize, in, insize, settings);
  }
}